

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int coda_time_double_to_parts_utc
              (double datetime,int *year,int *month,int *day,int *hour,int *minute,int *second,
              int *musec)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  undefined4 in_EAX;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *message;
  long in_FS_OFFSET;
  double dVar8;
  undefined1 auVar9 [16];
  int s;
  int min;
  int h;
  int y;
  int m;
  int d;
  double local_50;
  double local_48;
  ulong local_40;
  int *local_38;
  
  auVar9._0_4_ = -(uint)(year == (int *)0x0);
  auVar9._4_4_ = -(uint)(month == (int *)0x0);
  auVar9._8_4_ = -(uint)(day == (int *)0x0);
  auVar9._12_4_ = -(uint)(hour == (int *)0x0);
  iVar4 = movmskps(in_EAX,auVar9);
  if ((((iVar4 == 0) && (minute != (int *)0x0)) && (second != (int *)0x0)) && (musec != (int *)0x0))
  {
    iVar4 = coda_isNaN(datetime);
    if (iVar4 == 0) {
      iVar4 = coda_isInf(datetime);
      if (iVar4 == 0) {
        local_50 = floor(datetime + 5e-07);
        lVar2 = *(long *)(in_FS_OFFSET + -0x108);
        if (lVar2 != 0) {
          uVar5 = *(uint *)(in_FS_OFFSET + -0x100);
          uVar6 = (ulong)uVar5;
          if (0 < (int)uVar5) {
            uVar7 = 0;
            do {
              if (uVar6 == uVar7) {
LAB_0012d193:
                bVar3 = ABS(local_50 - *(double *)(lVar2 + uVar6 * 8)) < 0.1;
                local_40 = (ulong)bVar3;
                local_48 = (double)(int)(uVar5 + bVar3 + 10);
                local_50 = local_50 - local_48;
                local_38 = second;
                dVar8 = floor(local_50 / 86400.0);
                iVar4 = mjd2000_to_dmy((int)dVar8,&d,&m,&y);
                if (iVar4 != 0) {
                  return -1;
                }
                iVar4 = seconds_to_hms((int)((double)(int)dVar8 * -86400.0 + local_50),&h,&min,&s);
                if (iVar4 != 0) {
                  return -1;
                }
                dVar8 = floor((((datetime + 5e-07) - local_48) - local_50) * 1000000.0);
                *year = y;
                *month = m;
                *day = d;
                *hour = h;
                *minute = min;
                *local_38 = (int)local_40 + s;
                *musec = (int)dVar8;
                return 0;
              }
              pdVar1 = (double *)(lVar2 + uVar7 * 8);
              if (local_50 < *pdVar1 || local_50 == *pdVar1) {
                uVar5 = (uint)uVar7;
                uVar6 = uVar7;
                goto LAB_0012d193;
              }
              uVar7 = uVar7 + 1;
            } while( true );
          }
        }
        __assert_fail("leap_second_table != NULL && num_leap_seconds > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                      ,0x37e,
                      "int coda_time_double_to_parts_utc(double, int *, int *, int *, int *, int *, int *, int *)"
                     );
      }
      message = "datetime argument is Infinite";
    }
    else {
      message = "datetime argument is NaN";
    }
    coda_set_error(-0x68,message);
  }
  else {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x36a);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_time_double_to_parts_utc(double datetime, int *year, int *month, int *day, int *hour, int *minute,
                                              int *second, int *musec)
{
    double seconds;
    int d, m, y;
    int h, min, s, us;
    int days, dayseconds;
    int leap_sec;
    int is_leap_sec;

    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (coda_isNaN(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is NaN");
        return -1;
    }
    if (coda_isInf(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is Infinite");
        return -1;
    }

    /* we add 0.5 milliseconds so the floor() becomes a round() that rounds at the millisecond */
    datetime += 5E-7;

    seconds = floor(datetime);

    assert(leap_second_table != NULL && num_leap_seconds > 0);
    leap_sec = 0;
    while (leap_sec < num_leap_seconds && seconds > leap_second_table[leap_sec])
    {
        leap_sec++;
    }
    is_leap_sec = fabs(seconds - leap_second_table[leap_sec]) < 0.1;
    seconds -= 10 + leap_sec + is_leap_sec;
    datetime -= 10 + leap_sec + is_leap_sec;

    days = (int)floor(seconds / 86400.0);

    if (mjd2000_to_dmy(days, &d, &m, &y) != 0)
    {
        return -1;
    }

    dayseconds = (int)(seconds - days * 86400.0);

    if (seconds_to_hms(dayseconds, &h, &min, &s) != 0)
    {
        return -1;
    }

    us = (int)floor((datetime - seconds) * 1E6);

    *year = y;
    *month = m;
    *day = d;
    *hour = h;
    *minute = min;
    *second = s + is_leap_sec;
    *musec = us;

    return 0;
}